

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

bool spvtools::val::anon_unknown_0::hasImportLinkageAttribute(uint32_t id,ValidationState_t *vstate)

{
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  uint32_t local_c;
  
  local_c = id;
  pmVar1 = std::
           map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
           ::operator[](&vstate->id_decorations_,&local_c);
  p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  while (((_Rb_tree_header *)p_Var2 != p_Var3 &&
         (((p_Var2[1]._M_color != 0x29 ||
           ((ulong)((long)p_Var2[1]._M_left - (long)p_Var2[1]._M_parent) < 5)) ||
          (*(int *)((long)&p_Var2[1]._M_left[-1]._M_right + 4) != 1))))) {
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return (_Rb_tree_header *)p_Var2 != p_Var3;
}

Assistant:

bool hasImportLinkageAttribute(uint32_t id, ValidationState_t& vstate) {
  const auto& decorations = vstate.id_decorations(id);
  return std::any_of(
      decorations.begin(), decorations.end(), [](const Decoration& d) {
        return spv::Decoration::LinkageAttributes == d.dec_type() &&
               d.params().size() >= 2u &&
               spv::LinkageType(d.params().back()) == spv::LinkageType::Import;
      });
}